

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv_free_cpu_info(uv_cpu_info_t *cpu_infos,int count)

{
  int count_local;
  uv_cpu_info_t *cpu_infos_local;
  
  uv__free(cpu_infos);
  return;
}

Assistant:

void uv_free_cpu_info(uv_cpu_info_t* cpu_infos, int count) {
#ifdef __linux__
  (void) &count;
  uv__free(cpu_infos);
#else
  int i;

  for (i = 0; i < count; i++)
    uv__free(cpu_infos[i].model);

  uv__free(cpu_infos);
#endif  /* __linux__ */
}